

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

NeuralNetworkRegressor *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::NeuralNetworkRegressor>
          (Arena *arena)

{
  NeuralNetworkRegressor *this;
  
  if (arena == (Arena *)0x0) {
    this = (NeuralNetworkRegressor *)operator_new(0x58);
    CoreML::Specification::NeuralNetworkRegressor::NeuralNetworkRegressor(this,(Arena *)0x0,false);
  }
  else {
    this = (NeuralNetworkRegressor *)
           AllocateAlignedWithHook
                     (arena,0x58,
                      (type_info *)&CoreML::Specification::NeuralNetworkRegressor::typeinfo);
    CoreML::Specification::NeuralNetworkRegressor::NeuralNetworkRegressor(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }